

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

bool RunCommand(char *comment,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *command,bool verbose,int *retCodeOut)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  int local_84;
  undefined1 local_80 [3];
  bool res;
  int retCode;
  string output;
  string local_50;
  int *local_30;
  int *retCodeOut_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  bool verbose_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  char *comment_local;
  
  local_30 = retCodeOut;
  retCodeOut_local._7_1_ = verbose;
  pvStack_20 = command;
  command_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)comment;
  if (verbose) {
    poVar2 = std::operator<<((ostream *)&std::cout,comment);
    std::operator<<(poVar2,":\n");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_50,pvStack_20," ");
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string((string *)local_80);
  local_84 = 0;
  bVar1 = cmSystemTools::RunSingleCommand
                    (pvStack_20,(string *)local_80,(string *)local_80,&local_84,(char *)0x0,
                     OUTPUT_NONE,0.0);
  lVar3 = std::__cxx11::string::find(local_80,0x8efce0);
  if (((lVar3 == -1) || (!bVar1)) || (local_84 != 0)) {
    std::operator<<((ostream *)&std::cout,(string *)local_80);
  }
  if (bVar1) {
    if (local_30 == (int *)0x0) {
      if (local_84 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,(char *)command_local);
        poVar2 = std::operator<<(poVar2," failed. with ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_84);
        std::operator<<(poVar2,"\n");
      }
      comment_local._7_1_ = local_84 == 0;
    }
    else {
      *local_30 = local_84;
      comment_local._7_1_ = true;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,(char *)command_local);
    poVar2 = std::operator<<(poVar2," failed to run.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    comment_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_80);
  return (bool)(comment_local._7_1_ & 1);
}

Assistant:

static bool RunCommand(const char* comment,
                       std::vector<std::string>& command,
                       bool verbose,
                       int* retCodeOut = 0)
{
  if(verbose)
    {
    std::cout << comment << ":\n";
    std::cout << cmJoin(command, " ") << "\n";
    }
  std::string output;
  int retCode =0;
  // use rc command to create .res file
  bool res = cmSystemTools::RunSingleCommand(command,
                                             &output, &output,
                                             &retCode, 0,
                                             cmSystemTools::OUTPUT_NONE);
  // always print the output of the command, unless
  // it is the dumb rc command banner, but if the command
  // returned an error code then print the output anyway as
  // the banner may be mixed with some other important information.
  if(output.find("Resource Compiler Version") == output.npos
     || !res || retCode)
    {
    std::cout << output;
    }
  if (!res)
    {
    std::cout << comment << " failed to run." << std::endl;
    return false;
    }
  // if retCodeOut is requested then always return true
  // and set the retCodeOut to retCode
  if(retCodeOut)
    {
    *retCodeOut = retCode;
    return true;
    }
  if(retCode != 0)
    {
    std::cout << comment << " failed. with " << retCode << "\n";
    }
  return retCode == 0;
}